

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

Role __thiscall QAccessibleDisplay::role(QAccessibleDisplay *this)

{
  byte bVar1;
  byte bVar2;
  QLabel *pQVar3;
  QMovie *pQVar4;
  QProgressBar *pQVar5;
  QStatusBar *pQVar6;
  QAccessibleWidget *in_RDI;
  long in_FS_OFFSET;
  QLabel *l;
  undefined4 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  Role local_3c;
  QPicture local_38 [24];
  QPixmap local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)in_RDI + 0x18))();
  pQVar3 = qobject_cast<QLabel*>((QObject *)0x7eee13);
  if (pQVar3 == (QLabel *)0x0) {
    (**(code **)(*(long *)in_RDI + 0x18))();
    pQVar5 = qobject_cast<QProgressBar*>((QObject *)0x7eeed0);
    if (pQVar5 != (QProgressBar *)0x0) {
      local_3c = ProgressBar;
      goto LAB_007eef15;
    }
    (**(code **)(*(long *)in_RDI + 0x18))();
    pQVar6 = qobject_cast<QStatusBar*>((QObject *)0x7eeef3);
    if (pQVar6 != (QStatusBar *)0x0) {
      local_3c = StatusBar;
      goto LAB_007eef15;
    }
  }
  else {
    QLabel::pixmap((QLabel *)in_RDI);
    bVar1 = QPixmap::isNull();
    bVar1 = bVar1 ^ 0xff;
    QPixmap::~QPixmap(local_20);
    if ((bVar1 & 1) != 0) {
      local_3c = Graphic;
      goto LAB_007eef15;
    }
    QLabel::picture((QLabel *)in_RDI);
    bVar2 = QPicture::isNull();
    bVar2 = bVar2 ^ 0xff;
    QPicture::~QPicture(local_38);
    if ((bVar2 & 1) != 0) {
      local_3c = Graphic;
      goto LAB_007eef15;
    }
    pQVar4 = QLabel::movie((QLabel *)
                           CONCAT17(bVar1,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffa4,
                                                                  in_stack_ffffffffffffffa0))));
    if (pQVar4 != (QMovie *)0x0) {
      local_3c = Animation;
      goto LAB_007eef15;
    }
  }
  local_3c = QAccessibleWidget::role(in_RDI);
LAB_007eef15:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

QAccessible::Role QAccessibleDisplay::role() const
{
#if QT_CONFIG(label)
    QLabel *l = qobject_cast<QLabel*>(object());
    if (l) {
        if (!l->pixmap().isNull())
            return QAccessible::Graphic;
#ifndef QT_NO_PICTURE
        if (!l->picture().isNull())
            return QAccessible::Graphic;
#endif
#if QT_CONFIG(movie)
        if (l->movie())
            return QAccessible::Animation;
#endif
#if QT_CONFIG(progressbar)
    } else if (qobject_cast<QProgressBar*>(object())) {
        return QAccessible::ProgressBar;
#endif
#if QT_CONFIG(statusbar)
    } else if (qobject_cast<QStatusBar*>(object())) {
        return QAccessible::StatusBar;
#endif
    }
#endif
    return QAccessibleWidget::role();
}